

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW_LEQ_DOM
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,UDate startTime,
          UDate untilTime,UErrorCode *status)

{
  int iVar1;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (dayOfMonth * -0x49249249 + 0x12492492U < 0x24924925) {
    iVar1 = dayOfMonth / 7;
LAB_00207429:
    writeZonePropsByDOW(this,writer,isDst,zonename,fromOffset,toOffset,month,iVar1,dayOfWeek,
                        startTime,untilTime,status);
  }
  else {
    if (month == 1) {
      if (dayOfMonth == 0x1d) {
        iVar1 = -1;
        month = 1;
        goto LAB_00207429;
      }
    }
    else {
      iVar1 = *(int *)(MONTHLENGTH + (long)month * 4) - dayOfMonth;
      if (iVar1 * -0x49249249 + 0x12492492U < 0x24924925) {
        iVar1 = (int)((ulong)((long)iVar1 * 0x6db6db6d) >> 0x20) - iVar1;
        iVar1 = ((iVar1 >> 2) - (iVar1 >> 0x1f)) + -1;
        goto LAB_00207429;
      }
    }
    writeZonePropsByDOW_GEQ_DOM
              (this,writer,isDst,zonename,fromOffset,toOffset,month,dayOfMonth + -6,dayOfWeek,
               startTime,untilTime,status);
  }
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW_LEQ_DOM(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                                       int32_t fromOffset, int32_t toOffset,
                                       int32_t month, int32_t dayOfMonth, int32_t dayOfWeek,
                                       UDate startTime, UDate untilTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    // Check if this rule can be converted to DOW rule
    if (dayOfMonth%7 == 0) {
        // Can be represented by DOW rule
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                month, dayOfMonth/7, dayOfWeek, startTime, untilTime, status);
    } else if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - dayOfMonth)%7 == 0){
        // Can be represented by DOW rule with negative week number
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                month, -1*((MONTHLENGTH[month] - dayOfMonth)/7 + 1), dayOfWeek, startTime, untilTime, status);
    } else if (month == UCAL_FEBRUARY && dayOfMonth == 29) {
        // Specical case for February
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                UCAL_FEBRUARY, -1, dayOfWeek, startTime, untilTime, status);
    } else {
        // Otherwise, convert this to DOW_GEQ_DOM rule
        writeZonePropsByDOW_GEQ_DOM(writer, isDst, zonename, fromOffset, toOffset,
                month, dayOfMonth - 6, dayOfWeek, startTime, untilTime, status);
    }
}